

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::CFIReaderImpl::parseElement(CFIReaderImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  size_type sVar3;
  pointer pcVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  string *psVar7;
  byte *pbVar8;
  QName *pQVar9;
  long *plVar10;
  byte *pbVar11;
  runtime_error *this_00;
  DeadlyImportError *this_01;
  byte *pbVar12;
  ulong *puVar13;
  long lVar14;
  _func_int **pp_Var15;
  byte bVar16;
  value_type *__x;
  Attribute attr;
  __string_type __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [32];
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  undefined1 local_98 [40];
  value_type *local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  _Alloc_hider local_48;
  undefined8 local_38;
  
  local_38 = &this->attributes;
  std::vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
  _M_erase_at_end((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                   *)local_38,
                  (this->attributes).
                  super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  pbVar11 = this->dataP;
  local_70 = (value_type *)CONCAT44(local_70._4_4_,(uint)*pbVar11);
  if ((*pbVar11 & 0x3f) == 0x38) {
    pbVar8 = pbVar11 + 1;
    this->dataP = pbVar8;
    pbVar12 = this->dataEnd;
    if (pbVar12 == pbVar8 || (long)pbVar12 - (long)pbVar8 < 0) {
LAB_00616222:
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_0061625c;
    }
    this->dataP = pbVar11 + 2;
    bVar16 = pbVar11[1];
    if (bVar16 != 0xf0) {
      local_60 = (pointer)&(this->vocabulary).prefixTable;
      paVar1 = &local_148.field_2;
      local_68 = (pointer)&(this->vocabulary).namespaceNameTable;
      do {
        if ((bVar16 & 0xfc) != 0xcc) {
          this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
          goto LAB_0061625c;
        }
        local_128._8_8_ = 0;
        local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
        local_108._M_p = (pointer)&local_f8;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        local_c8._M_p = (pointer)&local_b8;
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_a8 = (element_type *)0x0;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_replace((ulong)local_128,0,(char *)0x0,0x7972a1);
        if ((bVar16 & 2) == 0) {
          local_148._M_string_length = 0;
          local_148.field_2._M_local_buf[0] = '\0';
          local_148._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          psVar7 = parseIdentifyingStringOrIndex
                             (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_60);
          pcVar4 = (psVar7->_M_dataplus)._M_p;
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar4,pcVar4 + psVar7->_M_string_length);
        }
        std::__cxx11::string::_M_assign((string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        if ((bVar16 & 1) == 0) {
          local_148._M_string_length = 0;
          local_148.field_2._M_local_buf[0] = '\0';
          local_148._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          psVar7 = parseIdentifyingStringOrIndex
                             (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_68);
          pcVar4 = (psVar7->_M_dataplus)._M_p;
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar4,pcVar4 + psVar7->_M_string_length);
        }
        std::__cxx11::string::_M_assign((string *)&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        if (local_e8._M_string_length == 0) {
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"xmlns","");
        }
        else {
          std::operator+(&local_148,"xmlns:",&local_e8);
        }
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        local_148._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_108._M_p,local_108._M_p + local_100);
        FIStringValue::create((FIStringValue *)local_98,&local_148);
        uVar5 = local_98._8_8_;
        local_a8 = (element_type *)local_98._0_8_;
        _Var6._M_pi = _Stack_a0._M_pi;
        local_98._0_8_ = (_func_int **)0x0;
        local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
        ::push_back((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                     *)local_38,(value_type *)local_128);
        if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,
                          CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,
                          CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        pbVar8 = this->dataP;
        pbVar12 = this->dataEnd;
        if ((long)pbVar12 - (long)pbVar8 < 1) goto LAB_00616222;
        this->dataP = pbVar8 + 1;
        bVar16 = *pbVar8;
      } while (bVar16 != 0xf0);
    }
    if (((long)pbVar12 - (long)(pbVar8 + 1) < 1) || (0x3f < pbVar8[1])) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_0061625c;
    }
  }
  pQVar9 = parseQualifiedNameOrIndex3(this,&(this->vocabulary).elementNameTable);
  sVar3 = (pQVar9->prefix)._M_string_length;
  if (sVar3 == 0) {
    local_128._0_8_ = local_128 + 0x10;
    pcVar4 = (pQVar9->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,pcVar4,pcVar4 + (pQVar9->name)._M_string_length);
  }
  else {
    pcVar4 = (pQVar9->prefix)._M_dataplus._M_p;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_148,pcVar4,pcVar4 + sVar3);
    std::__cxx11::string::_M_replace_aux((ulong)&local_148,local_148._M_string_length,0,'\x01');
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_148,(ulong)(pQVar9->name)._M_dataplus._M_p);
    local_128._0_8_ = local_128 + 0x10;
    puVar13 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar13) {
      local_128._16_8_ = *puVar13;
      local_128._24_8_ = plVar10[3];
    }
    else {
      local_128._16_8_ = *puVar13;
      local_128._0_8_ = (ulong *)*plVar10;
    }
    local_128._8_8_ = plVar10[1];
    *plVar10 = (long)puVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
  }
  __x = &this->nodeName;
  std::__cxx11::string::_M_assign((string *)__x);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((sVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2)) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  pbVar11 = this->dataP;
  lVar14 = (long)this->dataEnd - (long)pbVar11;
  if (((ulong)local_70 & 0x40) != 0) {
    local_70 = __x;
    if (0 < lVar14) {
      local_60 = (pointer)&(this->vocabulary).attributeNameTable;
      pp_Var2 = (_func_int **)(local_98 + 0x10);
      local_68 = (pointer)&(this->vocabulary).attributeValueTable;
      do {
        bVar16 = *pbVar11;
        if ((char)bVar16 < '\0') {
          if (0xef < bVar16) {
            this->emptyElement = bVar16 == 0xff;
            this->dataP = pbVar11 + 1;
            __x = local_70;
            goto LAB_006161b8;
          }
          this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
          goto LAB_0061625c;
        }
        local_128._0_8_ = local_128 + 0x10;
        local_128._8_8_ = 0;
        local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        local_c8._M_p = (pointer)&local_b8;
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_a8 = (element_type *)0x0;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_108._M_p = (pointer)&local_f8;
        parseQualifiedNameOrIndex2
                  (this,(vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
                         *)local_60);
        std::__cxx11::string::_M_assign((string *)local_128);
        std::__cxx11::string::_M_assign((string *)&local_108);
        std::__cxx11::string::_M_assign((string *)&local_e8);
        uVar5 = local_128._8_8_;
        if (local_128._8_8_ == 0) {
          local_98._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,local_e8._M_dataplus._M_p,
                     local_e8._M_dataplus._M_p + local_e8._M_string_length);
        }
        else {
          local_58 = (pointer)&local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_128._0_8_,
                     (pointer)(local_128._0_8_ + local_128._8_8_));
          std::__cxx11::string::_M_replace_aux((ulong)&local_58,(ulong)local_50,0,'\x01');
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_58,(ulong)local_e8._M_dataplus._M_p);
          pp_Var15 = (_func_int **)(plVar10 + 2);
          if ((_func_int **)*plVar10 == pp_Var15) {
            local_98._16_8_ = *pp_Var15;
            local_98._24_8_ = plVar10[3];
            local_98._0_8_ = pp_Var2;
          }
          else {
            local_98._16_8_ = *pp_Var15;
            local_98._0_8_ = (_func_int **)*plVar10;
          }
          local_98._8_8_ = plVar10[1];
          *plVar10 = (long)pp_Var15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
        }
        std::__cxx11::string::operator=((string *)&local_c8,(string *)local_98);
        if ((_func_int **)local_98._0_8_ != pp_Var2) {
          operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
        }
        if ((uVar5 != 0) && (local_58 != (pointer)&local_48)) {
          operator_delete(local_58,(ulong)(local_48._M_p + 1));
        }
        if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,(string *)&parseErrorMessage_abi_cxx11_);
          *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        parseNonIdentifyingStringOrIndex1
                  ((CFIReaderImpl *)local_98,
                   (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                    *)this);
        uVar5 = local_98._8_8_;
        local_a8 = (element_type *)local_98._0_8_;
        _Var6._M_pi = _Stack_a0._M_pi;
        local_98._0_8_ = (_func_int **)0x0;
        local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        std::
        vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
        ::push_back((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                     *)local_38,(value_type *)local_128);
        if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,
                          CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,
                          CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) +
                          1);
        }
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        pbVar11 = this->dataP;
      } while (0 < (long)this->dataEnd - (long)pbVar11);
    }
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
LAB_0061625c:
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (lVar14 < 1) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
    goto LAB_0061625c;
  }
  if (*pbVar11 != 0xf0) {
    if (*pbVar11 != 0xff) {
      this->emptyElement = false;
      goto LAB_006161b8;
    }
    this->terminatorPending = true;
  }
  this->emptyElement = true;
  this->dataP = pbVar11 + 1;
LAB_006161b8:
  if (this->emptyElement == false) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->elementStack).c,__x);
  }
  this->currentNodeType = EXN_ELEMENT;
  return;
}

Assistant:

void parseElement() {
        // C.3

        attributes.clear();

        uint8_t b = *dataP;
        bool hasAttributes = (b & 0x40) != 0; // C.3.3
        if ((b & 0x3f) == 0x38) { // C.3.4.1
            // Parse namespaces
            ++dataP;
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP++;
                if (b == 0xf0) { // C.3.4.3
                    break;
                }
                if ((b & 0xfc) != 0xcc) { // C.3.4.2
                    throw DeadlyImportError(parseErrorMessage);
                }
                // C.12
                Attribute attr;
                attr.qname.prefix = "xmlns";
                attr.qname.name = b & 0x02 ? parseIdentifyingStringOrIndex(vocabulary.prefixTable) : std::string();
                attr.qname.uri = b & 0x01 ? parseIdentifyingStringOrIndex(vocabulary.namespaceNameTable) : std::string();
                attr.name = attr.qname.name.empty() ? "xmlns" : "xmlns:" + attr.qname.name;
                attr.value = FIStringValue::create(std::string(attr.qname.uri));
                attributes.push_back(attr);
            }
            if ((dataEnd - dataP < 1) || (*dataP & 0xc0)) {
                throw DeadlyImportError(parseErrorMessage);
            }
        }

        // Parse Element name (C.3.5)
        const QName &elemName = parseQualifiedNameOrIndex3(vocabulary.elementNameTable);
        nodeName = elemName.prefix.empty() ? elemName.name : elemName.prefix + ':' + elemName.name;

        if (hasAttributes) {
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP;
                if (b < 0x80) { // C.3.6.1
                    // C.4
                    Attribute attr;
                    attr.qname = parseQualifiedNameOrIndex2(vocabulary.attributeNameTable);
                    attr.name = attr.qname.prefix.empty() ? attr.qname.name : attr.qname.prefix + ':' + attr.qname.name;
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    attr.value = parseNonIdentifyingStringOrIndex1(vocabulary.attributeValueTable);
                    attributes.push_back(attr);
                }
                else {
                    if ((b & 0xf0) != 0xf0) { // C.3.6.2
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    emptyElement = b == 0xff; // C.3.6.2, C.3.8
                    ++dataP;
                    break;
                }
            }
        }
        else {
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            b = *dataP;
            switch (b) {
            case 0xff:
                terminatorPending = true;
                // Intentionally fall through
            case 0xf0:
                emptyElement = true;
                ++dataP;
                break;
            default:
                emptyElement = false;
            }
        }
        if (!emptyElement) {
            elementStack.push(nodeName);
        }

        currentNodeType = irr::io::EXN_ELEMENT;
    }